

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

int Llb_ManFlowVerifyCut_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  
  while( true ) {
    if (pObj->TravId == p->nTravIds) {
      return 1;
    }
    pObj->TravId = p->nTravIds;
    iVar1 = Aig_ObjIsConst1(pObj);
    if (iVar1 != 0) {
      return 1;
    }
    uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
    if ((uVar2 & 7) == 2) {
      return 0;
    }
    if ((uVar2 & 7) - 7 < 0xfffffffe) break;
    iVar1 = Llb_ManFlowVerifyCut_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    if (iVar1 == 0) {
      return 0;
    }
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
  }
  __assert_fail("Aig_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Flow.c"
                ,0x2cb,"int Llb_ManFlowVerifyCut_rec(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

int Llb_ManFlowVerifyCut_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    // skip visited nodes
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return 1;
    Aig_ObjSetTravIdCurrent(p, pObj);
    // visit the node
    if ( Aig_ObjIsConst1(pObj) )
        return 1;
    if ( Aig_ObjIsCi(pObj) )
        return 0;
    // explore the fanins
    assert( Aig_ObjIsNode(pObj) );
    if ( !Llb_ManFlowVerifyCut_rec(p, Aig_ObjFanin0(pObj)) )
        return 0;
    if ( !Llb_ManFlowVerifyCut_rec(p, Aig_ObjFanin1(pObj)) )
        return 0;
    return 1;
}